

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall TimerHeap::handleTimeout(TimerHeap *this)

{
  bool bVar1;
  LogStream *pLVar2;
  reference pvVar3;
  element_type *peVar4;
  timeType_ tVar5;
  timeType_ local_2048;
  int local_2034;
  timeType_ local_2030;
  Logger local_2020;
  timeType_ local_1048;
  undefined1 local_1038 [8];
  TimerPtr tnow;
  timeType_ now;
  timespec tv;
  Logger local_ff8;
  ssize_t local_20;
  ssize_t size;
  uint64_t one;
  TimerHeap *this_local;
  
  one = (uint64_t)this;
  local_20 = read(this->timerfd_,&size,8);
  if (local_20 != 8) {
    Logger::Logger(&local_ff8,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/Timer.cpp"
                   ,0x77);
    pLVar2 = Logger::stream(&local_ff8);
    LogStream::operator<<(pLVar2,"Timeout Error");
    Logger::~Logger(&local_ff8);
  }
  clock_gettime(1,(timespec *)&now.msec);
  tnow.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)now.msec;
  now.sec = tv.tv_sec / 1000000;
  do {
    bVar1 = std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::empty
                      (&this->timerHeap_);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pvVar3 = std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::front
                       (&this->timerHeap_);
    std::shared_ptr<Timer>::shared_ptr((shared_ptr<Timer> *)local_1038,pvVar3);
    peVar4 = std::__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_1038);
    bVar1 = Timer::isDeleted(peVar4);
    if (bVar1) {
      pop(this,0);
LAB_001689d3:
      local_2034 = 0;
    }
    else {
      peVar4 = std::__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_1038);
      tVar5 = Timer::getTimeout(peVar4);
      local_1048 = tVar5;
      bVar1 = Timer::timeType_::operator>=
                        ((timeType_ *)
                         &tnow.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                         &local_1048);
      if (bVar1) {
        pop(this,0);
        Logger::Logger(&local_2020,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Raven65[P]WebServer/net/Timer.cpp"
                       ,0x83);
        pLVar2 = Logger::stream(&local_2020);
        LogStream::operator<<(pLVar2,"Connection Timeout!");
        Logger::~Logger(&local_2020);
        peVar4 = std::__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            local_1038);
        Timer::runCallBack(peVar4);
        goto LAB_001689d3;
      }
      peVar4 = std::__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Timer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          local_1038);
      tVar5 = Timer::getTimeout(peVar4);
      local_2030 = tVar5;
      bVar1 = setTime(this,(timeType_ *)
                           &tnow.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                      &local_2030);
      if (!bVar1) {
        pop(this,0);
        goto LAB_001689d3;
      }
      local_2034 = 3;
    }
    std::shared_ptr<Timer>::~shared_ptr((shared_ptr<Timer> *)local_1038);
  } while (local_2034 == 0);
  bVar1 = std::vector<std::shared_ptr<Timer>,_std::allocator<std::shared_ptr<Timer>_>_>::empty
                    (&this->timerHeap_);
  if (bVar1) {
    local_2048.sec = 0;
    local_2048.msec = 0;
    setTime(this,(timeType_ *)
                 &tnow.super___shared_ptr<Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount,&local_2048
           );
  }
  return;
}

Assistant:

void TimerHeap::handleTimeout() {
    uint64_t one;
    ssize_t size = read(timerfd_, &one, sizeof one);
    if (size != sizeof(uint64_t)) {
        LOG << "Timeout Error";
    }
    struct timespec tv;
    clock_gettime(CLOCK_MONOTONIC, &tv);
    Timer::timeType_ now = {tv.tv_sec, tv.tv_nsec / 1000 / 1000};
    while (!timerHeap_.empty()) {
        TimerPtr tnow = timerHeap_.front();
        if (tnow->isDeleted()) {
            pop(0);
//            LOG <<"delete";
        } else if (now >= tnow->getTimeout()) {
            pop(0);
            LOG << "Connection Timeout!";
            tnow->runCallBack();
        } else {
            if (setTime(now, tnow->getTimeout())) {
                break;
            } else {
                pop(0);
            }
        }
    }
    if (timerHeap_.empty()) setTime(now, {0, 0});
}